

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res,
          ContentReceiver *receiver,MultipartContentHeader *mulitpart_header,
          MultipartContentReceiver *multipart_receiver)

{
  size_t payload_max_length;
  bool bVar1;
  byte bVar2;
  const_iterator cVar3;
  long lVar4;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ContentReceiver out;
  string boundary;
  MultipartFormDataParser multipart_form_data_parser;
  key_type local_218;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  _Any_data local_1b8;
  code *local_1a8;
  undefined8 uStack_1a0;
  long *local_190 [2];
  long local_180 [2];
  _Any_data local_170;
  code *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [4];
  long local_c8;
  
  detail::MultipartFormDataParser::MultipartFormDataParser((MultipartFormDataParser *)local_150);
  local_1e8 = (code *)0x0;
  uStack_1e0 = 0;
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  bVar1 = Request::is_multipart_form_data(req);
  if (bVar1) {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Content-Type","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(req->headers)._M_t,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    if ((_Rb_tree_header *)cVar3._M_node == &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
      __s = "";
    }
    else {
      __s = *(char **)(cVar3._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_190,__s,(allocator<char> *)&local_218);
    local_1d8 = &local_1c8;
    local_1d0 = 0;
    local_1c8 = 0;
    lVar4 = std::__cxx11::string::find((char *)local_190,0x165ecf,0);
    if (lVar4 == -1) {
LAB_0014d4de:
      res->status = 400;
      bVar1 = write_response(this,strm,last_connection,req,res);
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)bVar1;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_218,(ulong)local_190);
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
      paVar5 = local_150;
      if (lVar4 == -1) goto LAB_0014d4de;
      std::__cxx11::string::_M_assign((string *)local_150[4]._M_local_buf);
      local_218._M_string_length = (size_type)multipart_receiver;
      local_218.field_2._M_allocated_capacity = (size_type)mulitpart_header;
      local_218._M_dataplus._M_p = (pointer)paVar5;
      std::function<bool(char_const*,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long)> *)local_1f8._M_pod_data,
                 (anon_class_24_3_23d8765b *)&local_218);
    }
    bVar2 = (byte)paVar5;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
    }
    if (local_190[0] != local_180) {
      operator_delete(local_190[0],local_180[0] + 1);
    }
    if (lVar4 == -1) goto LAB_0014d614;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::operator=
              ((function<bool_(const_char_*,_unsigned_long)> *)&local_1f8,receiver);
  }
  payload_max_length = this->payload_max_length_;
  local_1a8 = (code *)0x0;
  uStack_1a0 = 0;
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  std::function<bool_(const_char_*,_unsigned_long)>::function
            ((function<bool_(const_char_*,_unsigned_long)> *)&local_170,
             (function<bool_(const_char_*,_unsigned_long)> *)&local_1f8);
  bVar1 = detail::read_content<httplib::Request>
                    (strm,req,payload_max_length,&res->status,(Progress *)&local_1b8,
                     (ContentReceiver *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,__destroy_functor);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if (bVar1) {
    bVar1 = Request::is_multipart_form_data(req);
    bVar2 = 1;
    if (!bVar1 || local_c8 != 0) goto LAB_0014d614;
    res->status = 400;
  }
  bVar2 = write_response(this,strm,last_connection,req,res);
LAB_0014d614:
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  detail::MultipartFormDataParser::~MultipartFormDataParser((MultipartFormDataParser *)local_150);
  return (bool)(bVar2 & 1);
}

Assistant:

inline bool
Server::read_content_core(Stream &strm, bool last_connection,
                          Request &req, Response &res,
                          ContentReceiver receiver,
                          MultipartContentHeader mulitpart_header,
                          MultipartContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiver out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return write_response(strm, last_connection, req, res);
    }

    multipart_form_data_parser.set_boundary(boundary);
    out = [&](const char *buf, size_t n) {
      return multipart_form_data_parser.parse(buf, n, multipart_receiver, mulitpart_header);
    };
  } else {
    out = receiver;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status,
                            Progress(), out)) {
    return write_response(strm, last_connection, req, res);
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return write_response(strm, last_connection, req, res);
    }
  }

  return true;
}